

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

uint8_t * lre_compile(int *plen,char *error_msg,int error_msg_size,char *buf,size_t buf_len,
                     int re_flags,void *opaque)

{
  byte *pbVar1;
  uint val;
  int iVar2;
  BOOL BVar3;
  uint8_t *in_RCX;
  int in_EDX;
  char *in_RSI;
  undefined4 *in_RDI;
  long in_R8;
  uint in_R9D;
  BOOL is_sticky;
  int stack_size;
  REParseState *s;
  REParseState s_s;
  uint32_t in_stack_fffffffffffffe9c;
  REParseState *s_00;
  REParseState *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb4;
  uint8_t *in_stack_fffffffffffffeb8;
  
  s_00 = (REParseState *)&stack0xfffffffffffffea8;
  memset(s_00,0,0x120);
  s_00->opaque = s;
  s_00->buf_ptr = in_RCX;
  s_00->buf_end = s_00->buf_ptr + in_R8;
  s_00->buf_start = s_00->buf_ptr;
  s_00->re_flags = in_R9D;
  s_00->is_utf16 = (uint)((in_R9D & 0x10) != 0);
  val = (uint)((in_R9D & 0x20) != 0);
  s_00->ignore_case = (uint)((in_R9D & 2) != 0);
  s_00->dotall = (uint)((in_R9D & 8) != 0);
  s_00->capture_count = 1;
  s_00->total_capture_count = -1;
  s_00->has_named_captures = -1;
  dbuf_init2(&s_00->byte_code,(void *)CONCAT44(in_stack_fffffffffffffe9c,val),
             (DynBufReallocFunc *)0x1c7ce2);
  dbuf_init2(&s_00->byte_code,(void *)CONCAT44(in_stack_fffffffffffffe9c,val),
             (DynBufReallocFunc *)0x1c7cff);
  dbuf_putc(&s_00->byte_code,(uint8_t)(in_stack_fffffffffffffe9c >> 0x18));
  dbuf_putc(&s_00->byte_code,(uint8_t)(in_stack_fffffffffffffe9c >> 0x18));
  dbuf_putc(&s_00->byte_code,(uint8_t)(in_stack_fffffffffffffe9c >> 0x18));
  dbuf_put_u32(&s_00->byte_code,in_stack_fffffffffffffe9c);
  if (val == 0) {
    re_emit_op_u32(s_00,in_stack_fffffffffffffe9c,0);
    re_emit_op(s_00,in_stack_fffffffffffffe9c);
    re_emit_op_u32(s_00,in_stack_fffffffffffffe9c,val);
  }
  re_emit_op_u8(s_00,in_stack_fffffffffffffe9c,val);
  iVar2 = re_parse_disjunction(in_stack_fffffffffffffea8,(BOOL)((ulong)s_00 >> 0x20));
  if (iVar2 == 0) {
    re_emit_op_u8(s_00,in_stack_fffffffffffffe9c,val);
    re_emit_op(s_00,in_stack_fffffffffffffe9c);
    if (*s_00->buf_ptr == '\0') {
      BVar3 = dbuf_error(&s_00->byte_code);
      if (BVar3 == 0) {
        iVar2 = compute_stack_size(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
        if (-1 < iVar2) {
          (s_00->byte_code).buf[1] = (uint8_t)s_00->capture_count;
          (s_00->byte_code).buf[2] = (uint8_t)iVar2;
          put_u32((s_00->byte_code).buf + 3,(int)(s_00->byte_code).size - 7);
          if ((ulong)(long)(s_00->capture_count + -1) < (s_00->group_names).size) {
            dbuf_put(&in_stack_fffffffffffffea8->byte_code,(uint8_t *)s_00,CONCAT44(iVar2,val));
            pbVar1 = (s_00->byte_code).buf;
            *pbVar1 = *pbVar1 | 0x80;
          }
          dbuf_free((DynBuf *)0x1c7f30);
          *in_RSI = '\0';
          *in_RDI = (int)(s_00->byte_code).size;
          return (s_00->byte_code).buf;
        }
        re_parse_error(s_00,"too many imbricated quantifiers");
      }
      else {
        re_parse_out_of_memory((REParseState *)0x1c7e51);
      }
    }
    else {
      re_parse_error(s_00,"extraneous characters at the end");
    }
  }
  dbuf_free((DynBuf *)0x1c7da2);
  dbuf_free((DynBuf *)0x1c7db0);
  pstrcpy(in_RSI,in_EDX,(s_00->u).error_msg);
  *in_RDI = 0;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *lre_compile(int *plen, char *error_msg, int error_msg_size,
                     const char *buf, size_t buf_len, int re_flags,
                     void *opaque)
{
    REParseState s_s, *s = &s_s;
    int stack_size;
    BOOL is_sticky;
    
    memset(s, 0, sizeof(*s));
    s->opaque = opaque;
    s->buf_ptr = (const uint8_t *)buf;
    s->buf_end = s->buf_ptr + buf_len;
    s->buf_start = s->buf_ptr;
    s->re_flags = re_flags;
    s->is_utf16 = ((re_flags & LRE_FLAG_UTF16) != 0);
    is_sticky = ((re_flags & LRE_FLAG_STICKY) != 0);
    s->ignore_case = ((re_flags & LRE_FLAG_IGNORECASE) != 0);
    s->dotall = ((re_flags & LRE_FLAG_DOTALL) != 0);
    s->capture_count = 1;
    s->total_capture_count = -1;
    s->has_named_captures = -1;
    
    dbuf_init2(&s->byte_code, opaque, lre_realloc);
    dbuf_init2(&s->group_names, opaque, lre_realloc);

    dbuf_putc(&s->byte_code, re_flags); /* first element is the flags */
    dbuf_putc(&s->byte_code, 0); /* second element is the number of captures */
    dbuf_putc(&s->byte_code, 0); /* stack size */
    dbuf_put_u32(&s->byte_code, 0); /* bytecode length */
    
    if (!is_sticky) {
        /* iterate thru all positions (about the same as .*?( ... ) )
           .  We do it without an explicit loop so that lock step
           thread execution will be possible in an optimized
           implementation */
        re_emit_op_u32(s, REOP_split_goto_first, 1 + 5);
        re_emit_op(s, REOP_any);
        re_emit_op_u32(s, REOP_goto, -(5 + 1 + 5));
    }
    re_emit_op_u8(s, REOP_save_start, 0);

    if (re_parse_disjunction(s, FALSE)) {
    error:
        dbuf_free(&s->byte_code);
        dbuf_free(&s->group_names);
        pstrcpy(error_msg, error_msg_size, s->u.error_msg);
        *plen = 0;
        return NULL;
    }

    re_emit_op_u8(s, REOP_save_end, 0);
    
    re_emit_op(s, REOP_match);

    if (*s->buf_ptr != '\0') {
        re_parse_error(s, "extraneous characters at the end");
        goto error;
    }

    if (dbuf_error(&s->byte_code)) {
        re_parse_out_of_memory(s);
        goto error;
    }
    
    stack_size = compute_stack_size(s->byte_code.buf, s->byte_code.size);
    if (stack_size < 0) {
        re_parse_error(s, "too many imbricated quantifiers");
        goto error;
    }
    
    s->byte_code.buf[RE_HEADER_CAPTURE_COUNT] = s->capture_count;
    s->byte_code.buf[RE_HEADER_STACK_SIZE] = stack_size;
    put_u32(s->byte_code.buf + 3, s->byte_code.size - RE_HEADER_LEN);

    /* add the named groups if needed */
    if (s->group_names.size > (s->capture_count - 1)) {
        dbuf_put(&s->byte_code, s->group_names.buf, s->group_names.size);
        s->byte_code.buf[RE_HEADER_FLAGS] |= LRE_FLAG_NAMED_GROUPS;
    }
    dbuf_free(&s->group_names);
    
#ifdef DUMP_REOP
    lre_dump_bytecode(s->byte_code.buf, s->byte_code.size);
#endif
    
    error_msg[0] = '\0';
    *plen = s->byte_code.size;
    return s->byte_code.buf;
}